

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salesman.cpp
# Opt level: O3

double reduce(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *mtrx,double ss)

{
  pointer pvVar1;
  double dVar2;
  double *pdVar3;
  pointer pdVar4;
  double *pdVar5;
  ulong uVar6;
  iterator __beg_2;
  double *pdVar7;
  pointer pvVar8;
  iterator __beg;
  iterator iVar9;
  long lVar10;
  pointer pvVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  double dVar15;
  vector<double,_std::allocator<double>_> vec_help;
  vector<double,_std::allocator<double>_> vec_help1;
  vector<double,_std::allocator<double>_> vec2;
  vector<double,_std::allocator<double>_> vec1;
  vector<double,_std::allocator<double>_> local_c8;
  double *local_a8;
  iterator iStack_a0;
  double *local_98;
  double *local_88;
  iterator iStack_80;
  double *local_78;
  double *local_68;
  iterator iStack_60;
  double *local_58;
  double local_48;
  double local_40;
  double local_38;
  
  local_68 = (double *)0x0;
  iStack_60._M_current = (double *)0x0;
  local_58 = (double *)0x0;
  local_78 = (double *)0x0;
  local_88 = (double *)0x0;
  iStack_80._M_current = (double *)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_98 = (double *)0x0;
  local_a8 = (double *)0x0;
  iStack_a0._M_current = (double *)0x0;
  pvVar8 = (mtrx->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_40 = ss;
  if ((mtrx->
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pvVar8) {
    uVar14 = 0;
  }
  else {
    uVar12 = 0;
    do {
      pdVar4 = pvVar8[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar9._M_current = local_a8;
      if (pvVar8[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish != pdVar4) {
        lVar13 = 0;
        uVar14 = 0;
        do {
          if (iStack_a0._M_current == local_98) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)&local_a8,iStack_a0,
                       (double *)((long)pdVar4 + lVar13));
            pvVar8 = (mtrx->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            *iStack_a0._M_current = *(double *)((long)pdVar4 + lVar13);
            iStack_a0._M_current = iStack_a0._M_current + 1;
          }
          uVar14 = uVar14 + 1;
          pdVar4 = pvVar8[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar13 = lVar13 + 8;
          iVar9._M_current = iStack_a0._M_current;
        } while (uVar14 < (ulong)((long)pvVar8[uVar12].
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)pdVar4 >> 3));
      }
      uVar14 = (long)iVar9._M_current - (long)local_a8;
      pdVar5 = local_a8;
      if (0 < (long)uVar14 >> 5) {
        pdVar7 = (double *)((uVar14 & 0xffffffffffffffe0) + (long)local_a8);
        lVar13 = ((long)uVar14 >> 5) + 1;
        pdVar5 = local_a8 + 2;
        do {
          if (NAN(pdVar5[-2])) {
            pdVar5 = pdVar5 + -2;
            goto LAB_001022de;
          }
          if (NAN(pdVar5[-1])) {
            pdVar5 = pdVar5 + -1;
            goto LAB_001022de;
          }
          if (NAN(*pdVar5)) goto LAB_001022de;
          if (NAN(pdVar5[1])) {
            pdVar5 = pdVar5 + 1;
            goto LAB_001022de;
          }
          lVar13 = lVar13 + -1;
          pdVar5 = pdVar5 + 4;
        } while (1 < lVar13);
        uVar14 = (long)iVar9._M_current - (long)pdVar7;
        pdVar5 = pdVar7;
      }
      lVar13 = (long)uVar14 >> 3;
      if (lVar13 == 1) {
LAB_001022bf:
        if (NAN(*pdVar5)) goto LAB_001022de;
      }
      else {
        if (lVar13 == 2) {
LAB_001022ad:
          if (!NAN(*pdVar5)) {
            pdVar5 = pdVar5 + 1;
            goto LAB_001022bf;
          }
        }
        else {
          if (lVar13 != 3) goto LAB_00102311;
          if (!NAN(*pdVar5)) {
            pdVar5 = pdVar5 + 1;
            goto LAB_001022ad;
          }
        }
LAB_001022de:
        pdVar7 = pdVar5;
        if (pdVar5 != iVar9._M_current) {
          while (pdVar7 = pdVar7 + 1, pdVar7 != iVar9._M_current) {
            if (!NAN(*pdVar7)) {
              *pdVar5 = *pdVar7;
              pdVar5 = pdVar5 + 1;
            }
          }
        }
        if (pdVar5 != iVar9._M_current) {
          iVar9._M_current = pdVar5;
          iStack_a0._M_current = pdVar5;
        }
      }
LAB_00102311:
      pdVar5 = local_a8 + 1;
      pdVar7 = local_a8;
      if (pdVar5 != iVar9._M_current && local_a8 != iVar9._M_current) {
        dVar15 = *local_a8;
        do {
          dVar2 = *pdVar5;
          pdVar3 = pdVar5;
          if (dVar15 <= *pdVar5) {
            dVar2 = dVar15;
            pdVar3 = pdVar7;
          }
          pdVar7 = pdVar3;
          dVar15 = dVar2;
          pdVar5 = pdVar5 + 1;
        } while (pdVar5 != iVar9._M_current);
      }
      if (iStack_60._M_current == local_58) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_68,iStack_60,pdVar7);
      }
      else {
        *iStack_60._M_current = *pdVar7;
        iStack_60._M_current = iStack_60._M_current + 1;
      }
      if (iStack_a0._M_current != local_a8) {
        iStack_a0._M_current = local_a8;
      }
      uVar12 = uVar12 + 1;
      pvVar8 = (mtrx->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar14 = ((long)(mtrx->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8 >> 3) *
               -0x5555555555555555;
    } while (uVar12 <= uVar14 && uVar14 - uVar12 != 0);
  }
  if (uVar14 != 0) {
    uVar12 = 0;
    do {
      pdVar4 = pvVar8[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar13 = (long)pvVar8[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar4;
      if (lVar13 != 0) {
        lVar13 = lVar13 >> 3;
        lVar10 = 0;
        do {
          pdVar4[lVar10] = pdVar4[lVar10] - local_68[uVar12];
          lVar10 = lVar10 + 1;
        } while (lVar13 + (ulong)(lVar13 == 0) != lVar10);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar14);
  }
  if ((pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish ==
      (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar14 = 0;
  }
  else {
    uVar12 = 0;
    do {
      if ((mtrx->
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish != pvVar8) {
        lVar13 = 0;
        uVar14 = 0;
        do {
          lVar10 = *(long *)((long)&(pvVar8->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_start + lVar13);
          dVar15 = *(double *)(lVar10 + uVar12 * 8);
          if ((dVar15 != 0.0) || (NAN(dVar15))) {
            if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish = dVar15;
              goto LAB_0010246b;
            }
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,(double *)(lVar10 + uVar12 * 8));
          }
          else {
            local_38 = 0.0;
            if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                        (&local_c8,
                         (iterator)
                         local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_38);
            }
            else {
              *local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish = 0.0;
LAB_0010246b:
              local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          uVar14 = uVar14 + 1;
          pvVar8 = (mtrx->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar6 = ((long)(mtrx->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8 >> 3) *
                  -0x5555555555555555;
          lVar13 = lVar13 + 0x18;
        } while (uVar14 <= uVar6 && uVar6 - uVar14 != 0);
      }
      uVar14 = (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
      pdVar5 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (0 < (long)uVar14 >> 5) {
        pdVar7 = (double *)
                 ((uVar14 & 0xffffffffffffffe0) +
                 (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
        lVar13 = ((long)uVar14 >> 5) + 1;
        pdVar5 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + 2;
        do {
          if (NAN(pdVar5[-2])) {
            pdVar5 = pdVar5 + -2;
            goto LAB_0010258e;
          }
          if (NAN(pdVar5[-1])) {
            pdVar5 = pdVar5 + -1;
            goto LAB_0010258e;
          }
          if (NAN(*pdVar5)) goto LAB_0010258e;
          if (NAN(pdVar5[1])) {
            pdVar5 = pdVar5 + 1;
            goto LAB_0010258e;
          }
          lVar13 = lVar13 + -1;
          pdVar5 = pdVar5 + 4;
        } while (1 < lVar13);
        uVar14 = (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar7;
        pdVar5 = pdVar7;
      }
      lVar13 = (long)uVar14 >> 3;
      if (lVar13 == 1) {
LAB_0010256f:
        if (NAN(*pdVar5)) goto LAB_0010258e;
      }
      else {
        if (lVar13 == 2) {
LAB_0010255d:
          if (!NAN(*pdVar5)) {
            pdVar5 = pdVar5 + 1;
            goto LAB_0010256f;
          }
        }
        else {
          if (lVar13 != 3) goto LAB_001025d4;
          if (!NAN(*pdVar5)) {
            pdVar5 = pdVar5 + 1;
            goto LAB_0010255d;
          }
        }
LAB_0010258e:
        pdVar7 = pdVar5 + 1;
        if (pdVar7 != local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish &&
            pdVar5 != local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          do {
            if (!NAN(*pdVar7)) {
              *pdVar5 = *pdVar7;
              pdVar5 = pdVar5 + 1;
            }
            pdVar7 = pdVar7 + 1;
          } while (pdVar7 != local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish);
        }
        if (pdVar5 != local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = pdVar5;
        }
      }
LAB_001025d4:
      pdVar5 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
      pdVar7 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pdVar5 != local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish &&
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        dVar15 = *local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          dVar2 = *pdVar5;
          pdVar3 = pdVar5;
          if (dVar15 <= *pdVar5) {
            dVar2 = dVar15;
            pdVar3 = pdVar7;
          }
          pdVar7 = pdVar3;
          dVar15 = dVar2;
          pdVar5 = pdVar5 + 1;
        } while (pdVar5 != local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish);
      }
      if (iStack_80._M_current == local_78) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_88,iStack_80,pdVar7);
      }
      else {
        *iStack_80._M_current = *pdVar7;
        iStack_80._M_current = iStack_80._M_current + 1;
      }
      if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
      }
      uVar12 = uVar12 + 1;
      pvVar8 = (mtrx->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar14 = (long)(pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3;
    } while (uVar12 < uVar14);
  }
  if (uVar14 != 0) {
    pvVar1 = (mtrx->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    lVar13 = ((long)pvVar1 - (long)pvVar8 >> 3) * -0x5555555555555555;
    uVar12 = 0;
    do {
      lVar10 = lVar13 + (ulong)(lVar13 == 0);
      pvVar11 = pvVar8;
      if (pvVar1 != pvVar8) {
        do {
          pdVar4 = (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar4[uVar12] = pdVar4[uVar12] - local_88[uVar12];
          pvVar11 = pvVar11 + 1;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar14);
  }
  uVar14 = (long)iStack_60._M_current - (long)local_68;
  pdVar5 = local_68;
  if (0 < (long)uVar14 >> 5) {
    pdVar7 = (double *)((uVar14 & 0xffffffffffffffe0) + (long)local_68);
    lVar13 = ((long)uVar14 >> 5) + 1;
    pdVar5 = local_68 + 2;
    do {
      if (NAN(pdVar5[-2])) {
        pdVar5 = pdVar5 + -2;
        goto LAB_001027a1;
      }
      if (NAN(pdVar5[-1])) {
        pdVar5 = pdVar5 + -1;
        goto LAB_001027a1;
      }
      if (NAN(*pdVar5)) goto LAB_001027a1;
      if (NAN(pdVar5[1])) {
        pdVar5 = pdVar5 + 1;
        goto LAB_001027a1;
      }
      lVar13 = lVar13 + -1;
      pdVar5 = pdVar5 + 4;
    } while (1 < lVar13);
    uVar14 = (long)iStack_60._M_current - (long)pdVar7;
    pdVar5 = pdVar7;
  }
  lVar13 = (long)uVar14 >> 3;
  if (lVar13 == 1) {
LAB_00102782:
    if (NAN(*pdVar5)) goto LAB_001027a1;
  }
  else {
    if (lVar13 == 2) {
LAB_00102770:
      if (!NAN(*pdVar5)) {
        pdVar5 = pdVar5 + 1;
        goto LAB_00102782;
      }
    }
    else {
      if (lVar13 != 3) goto LAB_001027e0;
      if (!NAN(*pdVar5)) {
        pdVar5 = pdVar5 + 1;
        goto LAB_00102770;
      }
    }
LAB_001027a1:
    pdVar7 = pdVar5 + 1;
    if (pdVar7 != iStack_60._M_current && pdVar5 != iStack_60._M_current) {
      do {
        if (!NAN(*pdVar7)) {
          *pdVar5 = *pdVar7;
          pdVar5 = pdVar5 + 1;
        }
        pdVar7 = pdVar7 + 1;
      } while (pdVar7 != iStack_60._M_current);
    }
    if (pdVar5 != iStack_60._M_current) {
      iStack_60._M_current = pdVar5;
    }
  }
LAB_001027e0:
  uVar14 = (long)iStack_80._M_current - (long)local_88;
  pdVar5 = local_88;
  if (0 < (long)uVar14 >> 5) {
    pdVar7 = (double *)((uVar14 & 0xffffffffffffffe0) + (long)local_88);
    lVar13 = ((long)uVar14 >> 5) + 1;
    pdVar5 = local_88 + 2;
    do {
      if (NAN(pdVar5[-2])) {
        pdVar5 = pdVar5 + -2;
        goto LAB_001028b9;
      }
      if (NAN(pdVar5[-1])) {
        pdVar5 = pdVar5 + -1;
        goto LAB_001028b9;
      }
      if (NAN(*pdVar5)) goto LAB_001028b9;
      if (NAN(pdVar5[1])) {
        pdVar5 = pdVar5 + 1;
        goto LAB_001028b9;
      }
      lVar13 = lVar13 + -1;
      pdVar5 = pdVar5 + 4;
    } while (1 < lVar13);
    uVar14 = (long)iStack_80._M_current - (long)pdVar7;
    pdVar5 = pdVar7;
  }
  lVar13 = (long)uVar14 >> 3;
  if (lVar13 == 1) {
LAB_0010289a:
    if (!NAN(*pdVar5)) goto LAB_001028f8;
  }
  else if (lVar13 == 2) {
LAB_00102888:
    if (!NAN(*pdVar5)) {
      pdVar5 = pdVar5 + 1;
      goto LAB_0010289a;
    }
  }
  else {
    if (lVar13 != 3) goto LAB_001028f8;
    if (!NAN(*pdVar5)) {
      pdVar5 = pdVar5 + 1;
      goto LAB_00102888;
    }
  }
LAB_001028b9:
  pdVar7 = pdVar5 + 1;
  if (pdVar7 != iStack_80._M_current && pdVar5 != iStack_80._M_current) {
    do {
      if (!NAN(*pdVar7)) {
        *pdVar5 = *pdVar7;
        pdVar5 = pdVar5 + 1;
      }
      pdVar7 = pdVar7 + 1;
    } while (pdVar7 != iStack_80._M_current);
  }
  if (pdVar5 != iStack_80._M_current) {
    iStack_80._M_current = pdVar5;
  }
LAB_001028f8:
  local_48 = 0.0;
  for (pdVar5 = local_68; pdVar7 = local_88, pdVar5 != iStack_60._M_current; pdVar5 = pdVar5 + 1) {
    local_48 = local_48 + *pdVar5;
  }
  for (; pdVar7 != iStack_80._M_current; pdVar7 = pdVar7 + 1) {
    local_48 = local_48 + *pdVar7;
  }
  if (local_a8 != (double *)0x0) {
    operator_delete(local_a8,(long)local_98 - (long)local_a8);
  }
  if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_88 != (double *)0x0) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  if (local_68 != (double *)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  return local_48 + local_40;
}

Assistant:

double reduce(std::vector<std::vector<double>>& mtrx, double ss){

    std::vector<double> vec1,vec2,vec_help,vec_sum,vec_help1;
    double lower_bound = 0;

    for(int i=0; i<mtrx.size();i++){
        for (int j=0; j<mtrx[i].size(); j++){
            vec_help1.push_back(mtrx[i][j]);
        }
        vec_help1.erase(std::remove_if(std::begin(vec_help1),std::end(vec_help1), [](const auto& value) {return std::isnan(value);}),std::end(vec_help1));
        vec1.push_back(*std::min_element(vec_help1.begin(),vec_help1.end()));
        vec_help1.clear();
    }


    for(int i=0; i<mtrx.size();i++){
        for(int j=0; j<mtrx[i].size();j++){
            mtrx[i][j] -= vec1[i];
        }
    }

    for(int j=0; j<mtrx[0].size();j++){
        for(int i=0; i<mtrx.size();i++){
            if (mtrx[i][j]==0) {vec_help.push_back(0); continue;}
            else{
                vec_help.push_back(mtrx[i][j]);
            }
        }
        vec_help.erase(std::remove_if(std::begin(vec_help),std::end(vec_help), [](const auto& value) {return std::isnan(value);}),std::end(vec_help));
        vec2.push_back(*std::min_element(vec_help.begin(),vec_help.end()));
        vec_help.clear();
    }


    for(int j=0; j<mtrx[0].size();j++){
        for(int i=0; i<mtrx.size();i++){
            mtrx[i][j] -= vec2[j];
        }
    }


    vec1.erase(std::remove_if(std::begin(vec1),std::end(vec1), [](const auto& value) {return std::isnan(value);}),std::end(vec1));
    vec2.erase(std::remove_if(std::begin(vec2),std::end(vec2), [](const auto& value) {return std::isnan(value);}),std::end(vec2));


     for(std::vector<double>::iterator it = vec1.begin(); it!= vec1.end(); it++){
         lower_bound += *it;
     }
     for(std::vector<double>::iterator it = vec2.begin(); it!= vec2.end(); it++){
        lower_bound += *it;
     }
    return lower_bound + ss;
}